

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_highbd_convolve_2d_scale_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  undefined4 uVar4;
  long lVar5;
  uint16_t uVar6;
  int iVar7;
  int16_t *piVar8;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  InterpFilterParams *in_stack_00000008;
  InterpFilterParams *in_stack_00000010;
  int32_t tmp_1;
  int32_t tmp;
  CONV_BUF_TYPE res;
  int k_1;
  int32_t sum_1;
  int16_t *y_filter;
  int in_stack_00000030;
  int y_filter_idx;
  int16_t *src_y;
  int y_1;
  int y_qn;
  int x_1;
  int offset_bits;
  int16_t *src_vert;
  int k;
  int32_t sum;
  int16_t *x_filter;
  int x_filter_idx;
  uint16_t *src_x;
  int x;
  int x_qn;
  int y;
  uint16_t *src_horiz;
  int bits;
  int dst16_stride;
  CONV_BUF_TYPE *dst16;
  int fo_horiz;
  int fo_vert;
  int im_stride;
  int im_h;
  int16_t im_block [34304];
  int in_stack_fffffffffffef32c;
  int in_stack_fffffffffffef330;
  int iStack_10cb8;
  int iStack_10cb4;
  int iStack_10c98;
  uint uStack_10c94;
  int iStack_10c90;
  undefined2 *puStack_10c88;
  int iStack_10c80;
  int iStack_10c7c;
  int iStack_10c5c;
  uint uStack_10c58;
  int iStack_10c54;
  long lStack_10c50;
  undefined2 auStack_10c28 [34324];
  
  uVar1 = in_stack_00000010->taps;
  iVar7 = in_stack_00000010->taps / 2 - 1;
  uVar2 = in_stack_00000008->taps;
  lVar5 = *(long *)(src_y + 4);
  iVar3 = *(int *)(src_y + 8);
  lStack_10c50 = in_RDI + (long)(iVar7 * in_ESI) * -2;
  for (iStack_10c54 = 0;
      iStack_10c54 <
      (int)(((int)((in_R9D + -1) * in_stack_00000030 + (uint)y_filter) >> 10) + (uint)uVar1);
      iStack_10c54 = iStack_10c54 + 1) {
    uStack_10c58 = tmp;
    for (iStack_10c5c = 0; iStack_10c5c < in_R8D; iStack_10c5c = iStack_10c5c + 1) {
      piVar8 = av1_get_interp_filter_subpel_kernel
                         (in_stack_00000008,(int)(uStack_10c58 & 0x3ff) >> 6);
      iStack_10c7c = 1 << ((char)y_1 + 6U & 0x1f);
      for (iStack_10c80 = 0; iStack_10c80 < (int)(uint)in_stack_00000008->taps;
          iStack_10c80 = iStack_10c80 + 1) {
        iStack_10c7c = (int)piVar8[iStack_10c80] *
                       (uint)*(ushort *)
                              (lStack_10c50 + (long)((int)uStack_10c58 >> 10) * 2 +
                              (long)(int)(iStack_10c80 - (uVar2 / 2 - 1)) * 2) + iStack_10c7c;
      }
      auStack_10c28[iStack_10c54 * in_R8D + iStack_10c5c] =
           (short)(iStack_10c7c + ((1 << ((byte)*(undefined4 *)(src_y + 10) & 0x1f)) >> 1) >>
                  ((byte)*(undefined4 *)(src_y + 10) & 0x1f));
      uStack_10c58 = k_1 + uStack_10c58;
    }
    lStack_10c50 = lStack_10c50 + (long)in_ESI * 2;
  }
  puStack_10c88 = auStack_10c28 + iVar7 * in_R8D;
  uVar4 = *(undefined4 *)(src_y + 10);
  for (iStack_10c90 = 0; iStack_10c90 < in_R8D; iStack_10c90 = iStack_10c90 + 1) {
    uStack_10c94 = (uint)y_filter;
    for (iStack_10c98 = 0; iStack_10c98 < in_R9D; iStack_10c98 = iStack_10c98 + 1) {
      piVar8 = av1_get_interp_filter_subpel_kernel
                         (in_stack_00000010,(int)(uStack_10c94 & 0x3ff) >> 6);
      iStack_10cb4 = 1 << (((char)y_1 + '\x0e') - (char)uVar4 & 0x1fU);
      for (iStack_10cb8 = 0; iStack_10cb8 < (int)(uint)in_stack_00000010->taps;
          iStack_10cb8 = iStack_10cb8 + 1) {
        iStack_10cb4 = (int)piVar8[iStack_10cb8] *
                       (int)(short)puStack_10c88
                                   [(long)(((int)uStack_10c94 >> 10) * in_R8D) +
                                    (long)((iStack_10cb8 - iVar7) * in_R8D)] + iStack_10cb4;
      }
      if (*(int *)(src_y + 0x10) == 0) {
        uVar6 = clip_pixel_highbd(in_stack_fffffffffffef330,in_stack_fffffffffffef32c);
        *(uint16_t *)(in_RDX + (long)(iStack_10c98 * in_ECX + iStack_10c90) * 2) = uVar6;
      }
      else if (*(int *)src_y == 0) {
        *(short *)(lVar5 + (long)(iStack_10c98 * iVar3 + iStack_10c90) * 2) =
             (short)(iStack_10cb4 + ((1 << ((byte)*(undefined4 *)(src_y + 0xc) & 0x1f)) >> 1) >>
                    ((byte)*(undefined4 *)(src_y + 0xc) & 0x1f));
      }
      else {
        uVar6 = clip_pixel_highbd(in_stack_fffffffffffef330,in_stack_fffffffffffef32c);
        *(uint16_t *)(in_RDX + (long)(iStack_10c98 * in_ECX + iStack_10c90) * 2) = uVar6;
      }
      uStack_10c94 = in_stack_00000030 + uStack_10c94;
    }
    puStack_10c88 = puStack_10c88 + 1;
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_scale_c(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_x,
                                    const InterpFilterParams *filter_params_y,
                                    const int subpel_x_qn, const int x_step_qn,
                                    const int subpel_y_qn, const int y_step_qn,
                                    ConvolveParams *conv_params, int bd) {
  int16_t im_block[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE];
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  const int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  assert(bits >= 0);
  // horizontal filter
  const uint16_t *src_horiz = src - fo_vert * src_stride;
  for (int y = 0; y < im_h; ++y) {
    int x_qn = subpel_x_qn;
    for (int x = 0; x < w; ++x, x_qn += x_step_qn) {
      const uint16_t *const src_x = &src_horiz[(x_qn >> SCALE_SUBPEL_BITS)];
      const int x_filter_idx = (x_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(x_filter_idx < SUBPEL_SHIFTS);
      const int16_t *x_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_x, x_filter_idx);
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_x[k - fo_horiz];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
    src_horiz += src_stride;
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int x = 0; x < w; ++x) {
    int y_qn = subpel_y_qn;
    for (int y = 0; y < h; ++y, y_qn += y_step_qn) {
      const int16_t *src_y = &src_vert[(y_qn >> SCALE_SUBPEL_BITS) * im_stride];
      const int y_filter_idx = (y_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(y_filter_idx < SUBPEL_SHIFTS);
      const int16_t *y_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_y, y_filter_idx);
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_y[(k - fo_vert) * im_stride];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->is_compound) {
        if (conv_params->do_average) {
          int32_t tmp = dst16[y * dst16_stride + x];
          if (conv_params->use_dist_wtd_comp_avg) {
            tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
            tmp = tmp >> DIST_PRECISION_BITS;
          } else {
            tmp += res;
            tmp = tmp >> 1;
          }
          /* Subtract round offset and convolve round */
          tmp = tmp - ((1 << (offset_bits - conv_params->round_1)) +
                       (1 << (offset_bits - conv_params->round_1 - 1)));
          dst[y * dst_stride + x] =
              clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
        } else {
          dst16[y * dst16_stride + x] = res;
        }
      } else {
        /* Subtract round offset and convolve round */
        int32_t tmp = res - ((1 << (offset_bits - conv_params->round_1)) +
                             (1 << (offset_bits - conv_params->round_1 - 1)));
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
      }
    }
    src_vert++;
  }
}